

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

void __thiscall
cppnet::TimerContainer::GetIndexTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts,uint32_t index,uint32_t time_pass)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  iterator __first;
  iterator __last;
  weak_ptr<cppnet::TimerSlot> local_d0;
  undefined1 local_c0 [8];
  shared_ptr<cppnet::TimerSlot> target;
  _Self local_a8;
  iterator timer;
  __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
  local_88;
  const_iterator local_80;
  weak_ptr<cppnet::TimerSlot> *local_78;
  _List_node_base *local_70;
  _List_iterator<std::weak_ptr<cppnet::TimerSlot>_> local_68;
  __normal_iterator<std::weak_ptr<cppnet::TimerSlot>_*,_std::vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>
  local_60;
  const_iterator local_58;
  _Self local_50;
  _Self local_48;
  iterator timer_list;
  map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
  *bucket;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
  local_30;
  iterator bucket_iter;
  uint32_t time_pass_local;
  uint32_t index_local;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  *sub_timer_solts_local;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  *run_timer_solts_local;
  TimerContainer *this_local;
  
  bucket_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
  ._M_cur._0_4_ = time_pass;
  bucket_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
  ._M_cur._4_4_ = index;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
       ::find(&this->_timer_wheel,
              (key_type *)
              ((long)&bucket_iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                      ._M_cur + 4));
  bucket = (map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
            *)std::
              unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
              ::end(&this->_timer_wheel);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                      *)&bucket);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false,_false>
                           *)&local_30);
    timer_list._M_node = (_Base_ptr)&ppVar2->second;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
         ::begin((map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
                  *)timer_list._M_node);
    while( true ) {
      local_50._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
           ::end(timer_list._M_node);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
               ::operator->(&local_48);
      if (ppVar3->first == 0) {
        local_60._M_current =
             (weak_ptr<cppnet::TimerSlot> *)
             std::
             vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
             ::end(run_timer_solts);
        __gnu_cxx::
        __normal_iterator<std::weak_ptr<cppnet::TimerSlot>const*,std::vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>>
        ::__normal_iterator<std::weak_ptr<cppnet::TimerSlot>*>
                  ((__normal_iterator<std::weak_ptr<cppnet::TimerSlot>const*,std::vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>>
                    *)&local_58,&local_60);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                 ::operator->(&local_48);
        local_68._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
             ::begin(&ppVar3->second);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                 ::operator->(&local_48);
        local_70 = (_List_node_base *)
                   std::__cxx11::
                   list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                   ::end(&ppVar3->second);
        local_78 = (weak_ptr<cppnet::TimerSlot> *)
                   std::
                   vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                   ::insert<std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>>,void>
                             ((vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                               *)run_timer_solts,local_58,local_68,
                              (_List_iterator<std::weak_ptr<cppnet::TimerSlot>_>)local_70);
      }
      else {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                 ::operator->(&local_48);
        if ((uint32_t)
            bucket_iter.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
            ._M_cur < ppVar3->first) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                   ::operator->(&local_48);
          local_a8._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               ::begin(&ppVar3->second);
          while( true ) {
            ppVar3 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                     ::operator->(&local_48);
            target.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    std::__cxx11::
                    list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                    ::end(&ppVar3->second);
            bVar1 = std::operator!=(&local_a8,
                                    (_Self *)&target.
                                              super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
            if (!bVar1) break;
            std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>_>::operator->(&local_a8);
            std::weak_ptr<cppnet::TimerSlot>::lock((weak_ptr<cppnet::TimerSlot> *)local_c0);
            std::weak_ptr<cppnet::TimerSlot>::weak_ptr<cppnet::TimerSlot,void>
                      (&local_d0,(shared_ptr<cppnet::TimerSlot> *)local_c0);
            std::
            vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
            ::push_back(sub_timer_solts,&local_d0);
            std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_d0);
            std::shared_ptr<cppnet::TimerSlot>::~shared_ptr
                      ((shared_ptr<cppnet::TimerSlot> *)local_c0);
            std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>_>::operator++(&local_a8,0);
          }
        }
        else {
          local_88._M_current =
               (weak_ptr<cppnet::TimerSlot> *)
               std::
               vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               ::end(run_timer_solts);
          __gnu_cxx::
          __normal_iterator<std::weak_ptr<cppnet::TimerSlot>const*,std::vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>>
          ::__normal_iterator<std::weak_ptr<cppnet::TimerSlot>*>
                    ((__normal_iterator<std::weak_ptr<cppnet::TimerSlot>const*,std::vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>>
                      *)&local_80,&local_88);
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                   ::operator->(&local_48);
          __first = std::__cxx11::
                    list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                    ::begin(&ppVar3->second);
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                   ::operator->(&local_48);
          __last = std::__cxx11::
                   list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                   ::end(&ppVar3->second);
          timer._M_node =
               (_List_node_base *)
               std::
               vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
               ::insert<std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>>,void>
                         ((vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                           *)run_timer_solts,local_80,__first._M_node,__last._M_node);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
      ::operator++(&local_48,0);
    }
    Bitmap::Remove(&this->_bitmap,this->_cur_time);
    std::
    unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
    ::erase(&this->_timer_wheel,(iterator)local_30._M_cur);
  }
  return;
}

Assistant:

void TimerContainer::GetIndexTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts, 
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts, uint32_t index, uint32_t time_pass) {
    auto bucket_iter = _timer_wheel.find(index);
    if (bucket_iter == _timer_wheel.end()) {
        return;
    }
    auto& bucket = bucket_iter->second;

    for (auto timer_list = bucket.begin(); timer_list != bucket.end(); timer_list++) {
        if (timer_list->first == 0) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        if (timer_list->first <= time_pass) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); timer++) {
            auto target = timer->lock();
            sub_timer_solts.push_back(target);
        }
    }

    _bitmap.Remove(_cur_time);
    _timer_wheel.erase(bucket_iter);
}